

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List_TEST.cpp
# Opt level: O0

void __thiscall
Valid_test_case_List_List_unit_test_Test::~Valid_test_case_List_List_unit_test_Test
          (Valid_test_case_List_List_unit_test_Test *this)

{
  Valid_test_case_List_List_unit_test_Test *this_local;
  
  ~Valid_test_case_List_List_unit_test_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(Valid_test_case_List ,List_unit_test) {
    List<int> list;
//
    list.addHead(1);
    list.addHead(2);
    list.addHead(3);
    list.addHead(4);

    ASSERT_EQ(4, list.getHead());
    list.RemoveHead();
    ASSERT_EQ(3, list.getHead());
    list.RemoveHead();
    ASSERT_EQ(2, list.getHead());
    list.RemoveHead();
    ASSERT_EQ(1, list.getHead());
    list.RemoveHead();
//
    list.addTail(1);
    list.addTail(2);
    list.addTail(3);
    list.addTail(4);
//
    ASSERT_EQ(4, list.getTail());
    list.RemoveTail();
    ASSERT_EQ(3, list.getTail());
    list.RemoveTail();
    ASSERT_EQ(2, list.getTail());
    list.RemoveTail();
    ASSERT_EQ(1, list.getTail());
    list.RemoveTail();

}